

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffpdfl(fitsfile *fptr,int *status)

{
  int iVar1;
  FITSfile *pFVar2;
  long lVar3;
  size_t sVar4;
  byte bVar5;
  size_t __n;
  LONGLONG bytepos;
  int tstatus;
  char fill [2880];
  int local_b7c;
  byte local_b78 [2888];
  
  iVar1 = *status;
  if (0 < iVar1) {
    return iVar1;
  }
  pFVar2 = fptr->Fptr;
  if (fptr->HDUposition != pFVar2->curhdu) {
    return iVar1;
  }
  if (pFVar2->heapstart == 0) {
    return iVar1;
  }
  bytepos = pFVar2->heapstart + pFVar2->datastart + pFVar2->heapsize;
  lVar3 = ((bytepos + 0xb3f) / 0xb40) * -0xb40 + bytepos + 0xb3f;
  if (lVar3 < 0) {
    *status = 0x108;
    return 0x108;
  }
  bVar5 = (pFVar2->hdutype == 1) << 5;
  local_b7c = 0;
  if (lVar3 == 0xb3f) {
    bytepos = bytepos + -1;
    ffmbyt(fptr,bytepos,0,&local_b7c);
    __n = 1;
    ffgbyt(fptr,1,local_b78,&local_b7c);
    if (local_b7c == 0) goto LAB_00145284;
  }
  else {
    __n = 0xb3f - lVar3;
    ffmbyt(fptr,bytepos,0,&local_b7c);
    ffgbyt(fptr,__n,local_b78,&local_b7c);
    if (local_b7c == 0) {
      sVar4 = 0;
      do {
        if (local_b78[sVar4] != bVar5) {
          if (__n != sVar4) goto LAB_00145235;
          break;
        }
        sVar4 = sVar4 + 1;
      } while (__n != sVar4);
      goto LAB_00145284;
    }
  }
LAB_00145235:
  memset(local_b78,(uint)bVar5,__n);
  ffmbyt(fptr,bytepos,1,status);
  ffpbyt(fptr,__n,local_b78,status);
  if (*status < 1) {
    return *status;
  }
  ffxmsg(5,"Error writing Data Unit fill bytes (ffpdfl).");
LAB_00145284:
  return *status;
}

Assistant:

int ffpdfl(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  Write the Data Unit Fill values if they are not already correct.
  The fill values are used to fill out the last 2880 byte block of the HDU.
  Fill the data unit with zeros or blanks depending on the type of HDU
  from the end of the data to the end of the current FITS 2880 byte block
*/
{
    char chfill, fill[2880];
    LONGLONG fillstart;
    int nfill, tstatus, ii;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        return(*status);      /* fill has already been correctly written */

    if ((fptr->Fptr)->heapstart == 0)
        return(*status);      /* null data unit, so there is no fill */

    fillstart = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart +
                (fptr->Fptr)->heapsize;

    nfill = (long) ((fillstart + 2879) / 2880 * 2880 - fillstart);
    if (nfill >= 2880) /* can only happen if fillstart was negative */
    {
        *status = BAD_HEAP_PTR;
        return (*status);
    }
    
    if ((fptr->Fptr)->hdutype == ASCII_TBL)
        chfill = 32;         /* ASCII tables are filled with spaces */
    else
        chfill = 0;          /* all other extensions are filled with zeros */

    tstatus = 0;

    if (!nfill)  /* no fill bytes; just check that entire table exists */
    {
        fillstart--;
        nfill = 1;
        ffmbyt(fptr, fillstart, REPORT_EOF, &tstatus); /* move to last byte */
        ffgbyt(fptr, nfill, fill, &tstatus);           /* get the last byte */

        if (tstatus == 0)
            return(*status);  /* no EOF error, so everything is OK */
    }
    else
    {
        ffmbyt(fptr, fillstart, REPORT_EOF, &tstatus); /* move to fill area */
        ffgbyt(fptr, nfill, fill, &tstatus);           /* get the fill bytes */

        if (tstatus == 0)
        {
            for (ii = 0; ii < nfill; ii++)
            {
                if (fill[ii] != chfill)
                    break;
            }

            if (ii == nfill)
                return(*status);   /* all the fill values were correct */
        }
    }

    /* fill values are incorrect or have not been written, so write them */

    memset(fill, chfill, nfill);  /* fill the buffer with the fill value */

    ffmbyt(fptr, fillstart, IGNORE_EOF, status); /* move to fill area */
    ffpbyt(fptr, nfill, fill, status); /* write the fill bytes */

    if (*status > 0)
        ffpmsg("Error writing Data Unit fill bytes (ffpdfl).");

    return(*status);
}